

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mipsdsp_arith(DisasContext_conflict6 *ctx,uint32_t op1,uint32_t op2,int ret,int v1,int v2)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i32 pTVar1;
  TCGv_i32 sa_v;
  TCGv_i32 ret_t;
  TCGv_i32 sa_t_1;
  TCGv_i32 sa_t;
  TCGv_i64 v2_t;
  TCGv_i64 v1_t;
  TCGContext_conflict6 *tcg_ctx;
  int v2_local;
  int v1_local;
  int ret_local;
  uint32_t op2_local;
  uint32_t op1_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (ret != 0) {
    t = tcg_temp_new_i64(tcg_ctx_00);
    t_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,t,v1);
    gen_load_gpr(tcg_ctx_00,t_00,v2);
    switch(op1) {
    case 0x7c000010:
      if (op2 == 0x7c000010) {
        check_dsp(ctx);
        gen_helper_addu_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000050) {
        check_dsp(ctx);
        gen_helper_subu_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000110) {
        check_dsp(ctx);
        gen_helper_addu_s_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000150) {
        check_dsp(ctx);
        gen_helper_subu_s_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000210) {
        check_dsp_r2(ctx);
        gen_helper_addu_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000250) {
        check_dsp_r2(ctx);
        gen_helper_subu_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000290) {
        check_dsp(ctx);
        gen_helper_addq_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0002d0) {
        check_dsp(ctx);
        gen_helper_subq_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000310) {
        check_dsp_r2(ctx);
        gen_helper_addu_s_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000350) {
        check_dsp_r2(ctx);
        gen_helper_subu_s_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000390) {
        check_dsp(ctx);
        gen_helper_addq_s_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0003d0) {
        check_dsp(ctx);
        gen_helper_subq_s_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000410) {
        check_dsp(ctx);
        gen_helper_addsc(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000450) {
        check_dsp(ctx);
        gen_helper_addwc(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000490) {
        check_dsp(ctx);
        gen_helper_modsub(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000510) {
        check_dsp(ctx);
        gen_helper_raddu_w_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t);
      }
      else if (op2 == 0x7c000590) {
        check_dsp(ctx);
        gen_helper_addq_s_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0005d0) {
        check_dsp(ctx);
        gen_helper_subq_s_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      break;
    case 0x7c000011:
      if (op2 == 0x7c000311) {
        check_dsp(ctx);
        gen_helper_precrq_qb_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000351) {
        check_dsp_r2(ctx);
        gen_helper_precr_qb_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c0003d1) {
        check_dsp(ctx);
        gen_helper_precrqu_s_qb_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000511) {
        check_dsp(ctx);
        gen_helper_precrq_ph_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000551) {
        check_dsp(ctx);
        gen_helper_precrq_rs_ph_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000791) {
        check_dsp_r2(ctx);
        pTVar1 = tcg_const_i32_mips64el(tcg_ctx_00,v2);
        gen_helper_precr_sra_ph_w
                  (tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],pTVar1,t,tcg_ctx_00->cpu_gpr[ret]);
        tcg_temp_free_i32(tcg_ctx_00,pTVar1);
      }
      else if (op2 == 0x7c0007d1) {
        check_dsp_r2(ctx);
        pTVar1 = tcg_const_i32_mips64el(tcg_ctx_00,v2);
        gen_helper_precr_sra_r_ph_w
                  (tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],pTVar1,t,tcg_ctx_00->cpu_gpr[ret]);
        tcg_temp_free_i32(tcg_ctx_00,pTVar1);
      }
      break;
    case 0x7c000012:
      if (op2 == 0x7c000052) {
        check_dsp_r2(ctx);
        gen_helper_absq_s_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000112) {
        check_dsp(ctx);
        gen_helper_precequ_ph_qbl(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000152) {
        check_dsp(ctx);
        gen_helper_precequ_ph_qbr(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000192) {
        check_dsp(ctx);
        gen_helper_precequ_ph_qbla(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c0001d2) {
        check_dsp(ctx);
        gen_helper_precequ_ph_qbra(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000252) {
        check_dsp(ctx);
        gen_helper_absq_s_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000312) {
        check_dsp(ctx);
        tcg_gen_andi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00,0xffff0000);
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],tcg_ctx_00->cpu_gpr[ret]);
      }
      else if (op2 == 0x7c000352) {
        check_dsp(ctx);
        tcg_gen_andi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00,0xffff);
        tcg_gen_shli_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],tcg_ctx_00->cpu_gpr[ret],0x10)
        ;
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],tcg_ctx_00->cpu_gpr[ret]);
      }
      else if (op2 == 0x7c000452) {
        check_dsp(ctx);
        gen_helper_absq_s_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000712) {
        check_dsp(ctx);
        gen_helper_preceu_ph_qbl(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000752) {
        check_dsp(ctx);
        gen_helper_preceu_ph_qbr(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000792) {
        check_dsp(ctx);
        gen_helper_preceu_ph_qbla(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c0007d2) {
        check_dsp(ctx);
        gen_helper_preceu_ph_qbra(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      break;
    case 0x7c000014:
      if (op2 == 0x7c000014) {
        check_dsp(ctx);
        gen_helper_addu_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000054) {
        check_dsp(ctx);
        gen_helper_subu_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000114) {
        check_dsp(ctx);
        gen_helper_addu_s_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000154) {
        check_dsp(ctx);
        gen_helper_subu_s_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000214) {
        check_dsp_r2(ctx);
        gen_helper_addu_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000254) {
        check_dsp_r2(ctx);
        gen_helper_subu_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000294) {
        check_dsp(ctx);
        gen_helper_addq_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0002d4) {
        check_dsp(ctx);
        gen_helper_subq_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000314) {
        check_dsp_r2(ctx);
        gen_helper_addu_s_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000354) {
        check_dsp_r2(ctx);
        gen_helper_subu_s_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000394) {
        check_dsp(ctx);
        gen_helper_addq_s_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0003d4) {
        check_dsp(ctx);
        gen_helper_subq_s_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000494) {
        check_dsp(ctx);
        gen_helper_addq_pw(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0004d4) {
        check_dsp(ctx);
        gen_helper_subq_pw(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000514) {
        check_dsp(ctx);
        gen_helper_raddu_l_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t);
      }
      else if (op2 == 0x7c000594) {
        check_dsp(ctx);
        gen_helper_addq_s_pw(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0005d4) {
        check_dsp(ctx);
        gen_helper_subq_s_pw(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000614) {
        check_dsp_r2(ctx);
        gen_helper_adduh_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000654) {
        check_dsp_r2(ctx);
        gen_helper_subuh_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000694) {
        check_dsp_r2(ctx);
        gen_helper_adduh_r_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c0006d4) {
        check_dsp_r2(ctx);
        gen_helper_subuh_r_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      break;
    case 0x7c000015:
      if (op2 == 0x7c000315) {
        check_dsp(ctx);
        gen_helper_precrq_ob_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000355) {
        check_dsp_r2(ctx);
        gen_helper_precr_ob_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c0003d5) {
        check_dsp(ctx);
        gen_helper_precrqu_s_ob_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000515) {
        check_dsp(ctx);
        gen_helper_precrq_qh_pw(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000555) {
        check_dsp(ctx);
        gen_helper_precrq_rs_qh_pw(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000715) {
        check_dsp(ctx);
        gen_helper_precrq_pw_l(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000795) {
        check_dsp_r2(ctx);
        pTVar1 = tcg_const_i32_mips64el(tcg_ctx_00,ret);
        gen_helper_precr_sra_qh_pw(tcg_ctx_00,t_00,t,t_00,pTVar1);
        tcg_temp_free_i32(tcg_ctx_00,pTVar1);
      }
      else if (op2 == 0x7c0007d5) {
        check_dsp_r2(ctx);
        pTVar1 = tcg_const_i32_mips64el(tcg_ctx_00,ret);
        gen_helper_precr_sra_r_qh_pw(tcg_ctx_00,t_00,t,t_00,pTVar1);
        tcg_temp_free_i32(tcg_ctx_00,pTVar1);
      }
      break;
    case 0x7c000016:
      if (op2 == 0x7c000056) {
        check_dsp_r2(ctx);
        gen_helper_absq_s_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000116) {
        check_dsp(ctx);
        gen_helper_precequ_qh_obl(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000156) {
        check_dsp(ctx);
        gen_helper_precequ_qh_obr(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000196) {
        check_dsp(ctx);
        gen_helper_precequ_qh_obla(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c0001d6) {
        check_dsp(ctx);
        gen_helper_precequ_qh_obra(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000256) {
        check_dsp(ctx);
        gen_helper_absq_s_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000316) {
        check_dsp(ctx);
        gen_helper_preceq_pw_qhl(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000356) {
        check_dsp(ctx);
        gen_helper_preceq_pw_qhr(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000396) {
        check_dsp(ctx);
        gen_helper_preceq_pw_qhla(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c0003d6) {
        check_dsp(ctx);
        gen_helper_preceq_pw_qhra(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000456) {
        check_dsp(ctx);
        gen_helper_absq_s_pw(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000516) {
        check_dsp(ctx);
        tcg_gen_andi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00,-0x100000000);
      }
      else if (op2 == 0x7c000556) {
        check_dsp(ctx);
        tcg_gen_shli_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00,0x20);
      }
      else if (op2 == 0x7c000716) {
        check_dsp(ctx);
        gen_helper_preceu_qh_obl(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000756) {
        check_dsp(ctx);
        gen_helper_preceu_qh_obr(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c000796) {
        check_dsp(ctx);
        gen_helper_preceu_qh_obla(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      else if (op2 == 0x7c0007d6) {
        check_dsp(ctx);
        gen_helper_preceu_qh_obra(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t_00);
      }
      break;
    case 0x7c000018:
      check_dsp_r2(ctx);
      if (op2 == 0x7c000018) {
        gen_helper_adduh_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000058) {
        gen_helper_subuh_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000098) {
        gen_helper_adduh_r_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c0000d8) {
        gen_helper_subuh_r_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000218) {
        gen_helper_addqh_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000258) {
        gen_helper_subqh_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000298) {
        gen_helper_addqh_r_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c0002d8) {
        gen_helper_subqh_r_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000418) {
        gen_helper_addqh_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000458) {
        gen_helper_subqh_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000498) {
        gen_helper_addqh_r_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c0004d8) {
        gen_helper_subqh_r_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
    }
    tcg_temp_free_i64(tcg_ctx_00,t);
    tcg_temp_free_i64(tcg_ctx_00,t_00);
  }
  return;
}

Assistant:

static void gen_mipsdsp_arith(DisasContext *ctx, uint32_t op1, uint32_t op2,
                              int ret, int v1, int v2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv v1_t;
    TCGv v2_t;

    if (ret == 0) {
        /* Treat as NOP. */
        return;
    }

    v1_t = tcg_temp_new(tcg_ctx);
    v2_t = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, v1_t, v1);
    gen_load_gpr(tcg_ctx, v2_t, v2);

    switch (op1) {
    /* OPC_MULT_G_2E is equal OPC_ADDUH_QB_DSP */
    case OPC_MULT_G_2E:
        check_dsp_r2(ctx);
        switch (op2) {
        case OPC_ADDUH_QB:
            gen_helper_adduh_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDUH_R_QB:
            gen_helper_adduh_r_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQH_PH:
            gen_helper_addqh_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQH_R_PH:
            gen_helper_addqh_r_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQH_W:
            gen_helper_addqh_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQH_R_W:
            gen_helper_addqh_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBUH_QB:
            gen_helper_subuh_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBUH_R_QB:
            gen_helper_subuh_r_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBQH_PH:
            gen_helper_subqh_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBQH_R_PH:
            gen_helper_subqh_r_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBQH_W:
            gen_helper_subqh_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBQH_R_W:
            gen_helper_subqh_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        }
        break;
    case OPC_ABSQ_S_PH_DSP:
        switch (op2) {
        case OPC_ABSQ_S_QB:
            check_dsp_r2(ctx);
            gen_helper_absq_s_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ABSQ_S_PH:
            check_dsp(ctx);
            gen_helper_absq_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ABSQ_S_W:
            check_dsp(ctx);
            gen_helper_absq_s_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PRECEQ_W_PHL:
            check_dsp(ctx);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, 0xFFFF0000);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], tcg_ctx->cpu_gpr[ret]);
            break;
        case OPC_PRECEQ_W_PHR:
            check_dsp(ctx);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, 0x0000FFFF);
            tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], tcg_ctx->cpu_gpr[ret], 16);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], tcg_ctx->cpu_gpr[ret]);
            break;
        case OPC_PRECEQU_PH_QBL:
            check_dsp(ctx);
            gen_helper_precequ_ph_qbl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_PH_QBR:
            check_dsp(ctx);
            gen_helper_precequ_ph_qbr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_PH_QBLA:
            check_dsp(ctx);
            gen_helper_precequ_ph_qbla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_PH_QBRA:
            check_dsp(ctx);
            gen_helper_precequ_ph_qbra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_PH_QBL:
            check_dsp(ctx);
            gen_helper_preceu_ph_qbl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_PH_QBR:
            check_dsp(ctx);
            gen_helper_preceu_ph_qbr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_PH_QBLA:
            check_dsp(ctx);
            gen_helper_preceu_ph_qbla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_PH_QBRA:
            check_dsp(ctx);
            gen_helper_preceu_ph_qbra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        }
        break;
    case OPC_ADDU_QB_DSP:
        switch (op2) {
        case OPC_ADDQ_PH:
            check_dsp(ctx);
            gen_helper_addq_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_S_PH:
            check_dsp(ctx);
            gen_helper_addq_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_S_W:
            check_dsp(ctx);
            gen_helper_addq_s_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_QB:
            check_dsp(ctx);
            gen_helper_addu_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_S_QB:
            check_dsp(ctx);
            gen_helper_addu_s_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_PH:
            check_dsp_r2(ctx);
            gen_helper_addu_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_S_PH:
            check_dsp_r2(ctx);
            gen_helper_addu_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_PH:
            check_dsp(ctx);
            gen_helper_subq_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_S_PH:
            check_dsp(ctx);
            gen_helper_subq_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_S_W:
            check_dsp(ctx);
            gen_helper_subq_s_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_QB:
            check_dsp(ctx);
            gen_helper_subu_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_S_QB:
            check_dsp(ctx);
            gen_helper_subu_s_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_PH:
            check_dsp_r2(ctx);
            gen_helper_subu_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_S_PH:
            check_dsp_r2(ctx);
            gen_helper_subu_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDSC:
            check_dsp(ctx);
            gen_helper_addsc(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDWC:
            check_dsp(ctx);
            gen_helper_addwc(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MODSUB:
            check_dsp(ctx);
            gen_helper_modsub(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_RADDU_W_QB:
            check_dsp(ctx);
            gen_helper_raddu_w_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t);
            break;
        }
        break;
    case OPC_CMPU_EQ_QB_DSP:
        switch (op2) {
        case OPC_PRECR_QB_PH:
            check_dsp_r2(ctx);
            gen_helper_precr_qb_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_QB_PH:
            check_dsp(ctx);
            gen_helper_precrq_qb_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECR_SRA_PH_W:
            check_dsp_r2(ctx);
            {
                TCGv_i32 sa_t = tcg_const_i32(tcg_ctx, v2);
                gen_helper_precr_sra_ph_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], sa_t, v1_t,
                                          tcg_ctx->cpu_gpr[ret]);
                tcg_temp_free_i32(tcg_ctx, sa_t);
                break;
            }
        case OPC_PRECR_SRA_R_PH_W:
            check_dsp_r2(ctx);
            {
                TCGv_i32 sa_t = tcg_const_i32(tcg_ctx, v2);
                gen_helper_precr_sra_r_ph_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], sa_t, v1_t,
                                            tcg_ctx->cpu_gpr[ret]);
                tcg_temp_free_i32(tcg_ctx, sa_t);
                break;
            }
        case OPC_PRECRQ_PH_W:
            check_dsp(ctx);
            gen_helper_precrq_ph_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_RS_PH_W:
            check_dsp(ctx);
            gen_helper_precrq_rs_ph_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PRECRQU_S_QB_PH:
            check_dsp(ctx);
            gen_helper_precrqu_s_qb_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_ABSQ_S_QH_DSP:
        switch (op2) {
        case OPC_PRECEQ_L_PWL:
            check_dsp(ctx);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, 0xFFFFFFFF00000000ull);
            break;
        case OPC_PRECEQ_L_PWR:
            check_dsp(ctx);
            tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, 32);
            break;
        case OPC_PRECEQ_PW_QHL:
            check_dsp(ctx);
            gen_helper_preceq_pw_qhl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQ_PW_QHR:
            check_dsp(ctx);
            gen_helper_preceq_pw_qhr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQ_PW_QHLA:
            check_dsp(ctx);
            gen_helper_preceq_pw_qhla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQ_PW_QHRA:
            check_dsp(ctx);
            gen_helper_preceq_pw_qhra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_QH_OBL:
            check_dsp(ctx);
            gen_helper_precequ_qh_obl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_QH_OBR:
            check_dsp(ctx);
            gen_helper_precequ_qh_obr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_QH_OBLA:
            check_dsp(ctx);
            gen_helper_precequ_qh_obla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_QH_OBRA:
            check_dsp(ctx);
            gen_helper_precequ_qh_obra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_QH_OBL:
            check_dsp(ctx);
            gen_helper_preceu_qh_obl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_QH_OBR:
            check_dsp(ctx);
            gen_helper_preceu_qh_obr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_QH_OBLA:
            check_dsp(ctx);
            gen_helper_preceu_qh_obla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_QH_OBRA:
            check_dsp(ctx);
            gen_helper_preceu_qh_obra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_ABSQ_S_OB:
            check_dsp_r2(ctx);
            gen_helper_absq_s_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ABSQ_S_PW:
            check_dsp(ctx);
            gen_helper_absq_s_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ABSQ_S_QH:
            check_dsp(ctx);
            gen_helper_absq_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
    case OPC_ADDU_OB_DSP:
        switch (op2) {
        case OPC_RADDU_L_OB:
            check_dsp(ctx);
            gen_helper_raddu_l_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t);
            break;
        case OPC_SUBQ_PW:
            check_dsp(ctx);
            gen_helper_subq_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_S_PW:
            check_dsp(ctx);
            gen_helper_subq_s_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_QH:
            check_dsp(ctx);
            gen_helper_subq_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_S_QH:
            check_dsp(ctx);
            gen_helper_subq_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_OB:
            check_dsp(ctx);
            gen_helper_subu_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_S_OB:
            check_dsp(ctx);
            gen_helper_subu_s_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_QH:
            check_dsp_r2(ctx);
            gen_helper_subu_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_S_QH:
            check_dsp_r2(ctx);
            gen_helper_subu_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBUH_OB:
            check_dsp_r2(ctx);
            gen_helper_subuh_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBUH_R_OB:
            check_dsp_r2(ctx);
            gen_helper_subuh_r_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQ_PW:
            check_dsp(ctx);
            gen_helper_addq_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_S_PW:
            check_dsp(ctx);
            gen_helper_addq_s_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_QH:
            check_dsp(ctx);
            gen_helper_addq_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_S_QH:
            check_dsp(ctx);
            gen_helper_addq_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_OB:
            check_dsp(ctx);
            gen_helper_addu_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_S_OB:
            check_dsp(ctx);
            gen_helper_addu_s_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_QH:
            check_dsp_r2(ctx);
            gen_helper_addu_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_S_QH:
            check_dsp_r2(ctx);
            gen_helper_addu_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDUH_OB:
            check_dsp_r2(ctx);
            gen_helper_adduh_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDUH_R_OB:
            check_dsp_r2(ctx);
            gen_helper_adduh_r_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        }
        break;
    case OPC_CMPU_EQ_OB_DSP:
        switch (op2) {
        case OPC_PRECR_OB_QH:
            check_dsp_r2(ctx);
            gen_helper_precr_ob_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECR_SRA_QH_PW:
            check_dsp_r2(ctx);
            {
                TCGv_i32 ret_t = tcg_const_i32(tcg_ctx, ret);
                gen_helper_precr_sra_qh_pw(tcg_ctx, v2_t, v1_t, v2_t, ret_t);
                tcg_temp_free_i32(tcg_ctx, ret_t);
                break;
            }
        case OPC_PRECR_SRA_R_QH_PW:
            check_dsp_r2(ctx);
            {
                TCGv_i32 sa_v = tcg_const_i32(tcg_ctx, ret);
                gen_helper_precr_sra_r_qh_pw(tcg_ctx, v2_t, v1_t, v2_t, sa_v);
                tcg_temp_free_i32(tcg_ctx, sa_v);
                break;
            }
        case OPC_PRECRQ_OB_QH:
            check_dsp(ctx);
            gen_helper_precrq_ob_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_PW_L:
            check_dsp(ctx);
            gen_helper_precrq_pw_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_QH_PW:
            check_dsp(ctx);
            gen_helper_precrq_qh_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_RS_QH_PW:
            check_dsp(ctx);
            gen_helper_precrq_rs_qh_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PRECRQU_S_OB_QH:
            check_dsp(ctx);
            gen_helper_precrqu_s_ob_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, v1_t);
    tcg_temp_free(tcg_ctx, v2_t);
}